

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingScanState<long,_long>::BitpackingScanState
          (BitpackingScanState<long,_long> *this,ColumnSegment *segment)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  unsigned_long uVar3;
  ColumnSegment *in_RSI;
  SegmentScanState *in_RDI;
  BitpackingScanState<long,_long> *unaff_retaddr;
  unsigned_long bitpacking_metadata_offset;
  data_ptr_t data_ptr;
  BufferManager *buffer_manager;
  BufferHandle *in_stack_ffffffffffffff68;
  BufferHandle *in_stack_ffffffffffffff70;
  data_ptr_t pdVar4;
  BufferHandle *in_stack_ffffffffffffff80;
  undefined1 local_40 [24];
  BufferManager *local_28;
  ColumnSegment *local_10;
  
  local_10 = in_RSI;
  SegmentScanState::SegmentScanState(in_RDI);
  in_RDI->_vptr_SegmentScanState = (_func_int **)&PTR__BitpackingScanState_03510070;
  BufferHandle::BufferHandle(in_stack_ffffffffffffff80);
  in_RDI[4]._vptr_SegmentScanState = (_func_int **)local_10;
  in_RDI[0x80a]._vptr_SegmentScanState = (_func_int **)0x0;
  local_28 = BufferManager::GetBufferManager((DatabaseInstance *)0xa86ec9);
  (*local_28->_vptr_BufferManager[7])(local_40,local_28,&local_10->block);
  BufferHandle::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  BufferHandle::~BufferHandle(in_stack_ffffffffffffff70);
  pdVar1 = BufferHandle::Ptr((BufferHandle *)0xa86f2f);
  pdVar4 = pdVar1;
  iVar2 = ColumnSegment::GetBlockOffset(local_10);
  uVar3 = Load<unsigned_long>(pdVar4 + iVar2);
  iVar2 = ColumnSegment::GetBlockOffset(local_10);
  in_RDI[0x80c]._vptr_SegmentScanState = (_func_int **)(pdVar1 + (uVar3 - 4) + iVar2);
  LoadNextGroup(unaff_retaddr);
  return;
}

Assistant:

explicit BitpackingScanState(ColumnSegment &segment) : current_segment(segment) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
		handle = buffer_manager.Pin(segment.block);
		auto data_ptr = handle.Ptr();

		// load offset to bitpacking widths pointer
		auto bitpacking_metadata_offset = Load<idx_t>(data_ptr + segment.GetBlockOffset());
		bitpacking_metadata_ptr =
		    data_ptr + segment.GetBlockOffset() + bitpacking_metadata_offset - sizeof(bitpacking_metadata_encoded_t);

		// load the first group
		LoadNextGroup();
	}